

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O1

MetaCommandResult runCommand(string *input,Table *t)

{
  int iVar1;
  MetaCommandResult MVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)input);
  if (iVar1 != 0) {
    iVar1 = std::__cxx11::string::compare((char *)input);
    if (iVar1 == 0) {
      print_constants();
      MVar2 = CommandSuccess;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)input);
      MVar2 = CommandUnrecognized;
      if (iVar1 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Tree: ",6);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
        std::ostream::put('\x10');
        std::ostream::flush();
        MVar2 = CommandSuccess;
        Table::print(t,0,0);
      }
    }
    return MVar2;
  }
  Table::dbClose(t);
  Table::~Table(t);
  operator_delete(t,0x10);
  exit(0);
}

Assistant:

MetaCommandResult runCommand(std::string input, Table *t) {
	if (input == ".exit") {
		t->dbClose();
		delete t;
		exit(EXIT_SUCCESS);
	} else if(input == ".constants") {
		print_constants();
		return MetaCommandResult::CommandSuccess;
	} else if (input == ".btree") {
		std::cout<<"Tree: " << std::endl;
		t->print(0, 0);
		return MetaCommandResult::CommandSuccess;
	} else {
		return MetaCommandResult::CommandUnrecognized;
	}
}